

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  string cmd;
  string local_258;
  ifstream fin;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&fin,(string *)&FILEPATH_abi_cxx11_,_S_bin);
  if ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) {
    std::istream::read((char *)&fin,0x1091c8);
    std::istream::read((char *)&fin,0x10b1d0);
    std::istream::read((char *)&fin,0x12b1d0);
  }
  else {
    initialize();
  }
  std::ifstream::close();
  do {
    cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
    cmd._M_string_length = 0;
    cmd.field_2._M_local_buf[0] = '\0';
    std::operator<<((ostream *)&std::cout,">>");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&cmd);
    std::__cxx11::string::string((string *)&local_258,(string *)&cmd);
    operation(&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    bVar1 = flag;
    std::__cxx11::string::~string((string *)&cmd);
  } while (bVar1 != false);
  std::ifstream::~ifstream(&fin);
  return 0;
}

Assistant:

int main(){
    ifstream fin(FILEPATH, ios::binary);
    if (fin){
        fin.read((char *)&super_block, sizeof(Super_Block));
        fin.read((char *)inodes, sizeof(inodes));
        fin.read((char *)emptyspaces, sizeof(emptyspaces));
    }
    else{
        initialize();
    }
    fin.close();
    while(1){
        string cmd;
        cout << ">>";
        getline (cin, cmd);
        operation(cmd);
        if(!flag)break;
    }
    return 0;
}